

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOLocalBarrierCase::iterate(SSBOLocalBarrierCase *this)

{
  size_type *this_00;
  RenderContext *renderCtx;
  int iVar1;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  GLuint GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  char *pcVar8;
  ostream *poVar9;
  ProgramSources *sources;
  TestError *pTVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  allocator<char> local_4c9;
  SSBOLocalBarrierCase *local_4c8;
  ulong local_4c0;
  int local_4b4;
  string local_4b0;
  Buffer outputBuffer;
  undefined1 local_478 [40];
  BufferMemMap bufMap;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  iVar1 = (this->m_localSize).m_data[0];
  iVar12 = (this->m_localSize).m_data[1];
  iVar2 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] * (this->m_workSize).m_data[2]
  ;
  iVar15 = (this->m_localSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar8 = glu::getGLSLVersionDeclaration(version);
  poVar9 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"layout (local_size_x = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[0]);
  poVar9 = std::operator<<(poVar9,", local_size_y = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[1]);
  poVar9 = std::operator<<(poVar9,", local_size_z = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[2]);
  poVar9 = std::operator<<(poVar9,") in;\n");
  poVar9 = std::operator<<(poVar9,"layout(binding = 0) buffer Output {\n");
  poVar9 = std::operator<<(poVar9,"    coherent uint values[");
  uVar13 = iVar12 * iVar1 * iVar15;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2 * uVar13);
  poVar9 = std::operator<<(poVar9,"];\n");
  poVar9 = std::operator<<(poVar9,"} sb_out;\n\n");
  poVar9 = std::operator<<(poVar9,"shared uint offsets[");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar13);
  poVar9 = std::operator<<(poVar9,"];\n\n");
  poVar9 = std::operator<<(poVar9,"void main (void) {\n");
  poVar9 = std::operator<<(poVar9,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar9 = std::operator<<(poVar9,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar9 = std::operator<<(poVar9,"    uint globalOffs = localSize*globalNdx;\n");
  poVar9 = std::operator<<(poVar9,
                           "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                          );
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"    sb_out.values[globalOffs + localOffs] = globalOffs;\n");
  poVar9 = std::operator<<(poVar9,"    memoryBarrierBuffer();\n");
  poVar9 = std::operator<<(poVar9,"    barrier();\n");
  poVar9 = std::operator<<(poVar9,
                           "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"
                          );
  poVar9 = std::operator<<(poVar9,"    memoryBarrierBuffer();\n");
  poVar9 = std::operator<<(poVar9,"    barrier();\n");
  poVar9 = std::operator<<(poVar9,
                           "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
                          );
  std::operator<<(poVar9,"}\n");
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_478,&local_4b0);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)local_478);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_478 + 8));
  std::__cxx11::string::~string((string *)&local_4b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x281);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Work groups: ");
  tcu::operator<<((ostream *)this_00,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (*gl->useProgram)(program.m_program.m_program);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar3,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar4,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x28f);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x294);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar3,0x9303);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program.m_program.m_program,0x92e5,GVar3);
  iVar1 = 0;
  local_4c8 = this;
  BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,dVar4,1);
  uVar14 = 0;
  if (0 < (int)uVar13) {
    uVar14 = (ulong)uVar13;
  }
  if (iVar2 < 1) {
    iVar2 = iVar1;
  }
  local_4c0 = (ulong)-uVar13;
  lVar18 = 1;
  iVar12 = 0;
  do {
    if (iVar12 == iVar2) {
      BufferMemMap::~BufferMemMap(&bufMap);
      std::__cxx11::string::~string((string *)&valueInfo);
      tcu::TestContext::setTestResult
                ((local_4c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
      glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
      return STOP;
    }
    uVar17 = 0;
    iVar15 = iVar1;
    while (uVar14 != uVar17) {
      lVar16 = (long)iVar15;
      uVar6 = (uint)uVar17;
      uVar7 = uVar6;
      if (uVar17 == 0) {
        uVar7 = uVar13;
      }
      uVar11 = 0;
      if (uVar17 < 2) {
        uVar11 = uVar13;
      }
      uVar17 = uVar17 + 1;
      iVar15 = iVar15 + valueInfo.arrayStride;
      if (*(int *)((long)bufMap.m_ptr + lVar16 + (ulong)valueInfo.offset) !=
          (int)(uVar7 - 1) % (int)uVar13 + iVar12 * uVar13 +
          (int)((uVar6 - 2) + uVar11) % (int)uVar13) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Comparison failed for Output.values[",&local_4c9);
        local_4b4 = (int)uVar17 - (int)lVar18;
        de::toString<int>(&local_438,&local_4b4);
        std::operator+(&local_4b0,&local_418,&local_438);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478,&local_4b0,"]");
        tcu::TestError::TestError(pTVar10,(string *)local_478);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    iVar12 = iVar12 + 1;
    lVar18 = lVar18 + local_4c0;
    iVar1 = iVar1 + uVar13 * valueInfo.arrayStride;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    coherent uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint offsets[" << workGroupSize << "];\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    sb_out.values[globalOffs + localOffs] = globalOffs;\n"
			<< "    memoryBarrierBuffer();\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"
			<< "    memoryBarrierBuffer();\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const int		offs0		= localOffs-1 < 0 ? ((localOffs+workGroupSize-1)%workGroupSize) : ((localOffs-1)%workGroupSize);
					const int		offs1		= localOffs-2 < 0 ? ((localOffs+workGroupSize-2)%workGroupSize) : ((localOffs-2)%workGroupSize);
					const deUint32	ref			= (deUint32)(globalOffs + offs0 + offs1);

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}